

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O1

void __thiscall GrpParser::charOrIntOrRange(GrpParser *this)

{
  RefAST *this_00;
  ASTFactory *pAVar1;
  int iVar2;
  uint uVar3;
  RefAST RVar4;
  NoViableAltException *pNVar5;
  RefAST tmp142_AST;
  RefAST tmp139_AST;
  ASTPair currentAST;
  RefAST charOrIntOrRange_AST;
  ASTFactory local_d0;
  undefined1 local_c0 [16];
  RefCount<AST> aRStack_b0 [2];
  RefCount<AST> local_a0;
  RefCount<Token> local_98;
  RefCount<Token> local_90;
  RefCount<Token> local_88;
  RefCount<Token> local_80;
  RefCount<Token> local_78;
  RefToken local_70;
  RefToken local_68;
  RefAST local_60;
  RefAST local_58;
  RefAST local_50;
  RefToken local_48;
  RefAST local_40;
  RefAST local_38;
  
  this_00 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_00,&nullAST);
  local_a0.ref = nullAST.ref;
  local_c0._8_8_ = (factory_type)0x0;
  aRStack_b0[0].ref = (Ref *)0x0;
  if (nullAST.ref == (Ref *)0x0) {
    local_a0.ref = (Ref *)0x0;
  }
  else {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  local_d0.nodeFactory = (factory_type)nullAST;
  if (iVar2 == 0x11) {
    if (nullAST.ref == (Ref *)0x0) {
      local_d0.nodeFactory = (factory_type)0x0;
    }
    else {
      (nullAST.ref)->count = (nullAST.ref)->count + 1;
    }
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_80,this,1);
    pAVar1 = &(this->super_LLkParser).super_Parser.astFactory;
    ASTFactory::create(&local_d0,(RefToken *)pAVar1);
    RefCount<AST>::operator=((RefCount<AST> *)&local_d0.nodeFactory,(RefCount<AST> *)&local_d0);
    RefCount<AST>::~RefCount((RefCount<AST> *)&local_d0);
    RefCount<Token>::~RefCount(&local_80);
    if ((Ref *)local_d0.nodeFactory == (Ref *)0x0) {
      local_40.ref = (Ref *)0x0;
    }
    else {
      *(uint *)((long)local_d0.nodeFactory + 8) = *(uint *)((long)local_d0.nodeFactory + 8) + 1;
      local_40.ref = (Ref *)local_d0.nodeFactory;
    }
    ASTFactory::addASTChild(pAVar1,(ASTPair *)(local_c0 + 8),&local_40);
    RefCount<AST>::~RefCount(&local_40);
    Parser::match((Parser *)this,0x11);
  }
  else {
    if (iVar2 != 0x21) {
      pNVar5 = (NoViableAltException *)__cxa_allocate_exception(0x40);
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_48,this,1);
      NoViableAltException::NoViableAltException(pNVar5,&local_48);
      __cxa_throw(pNVar5,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException
                 );
    }
    if (nullAST.ref == (Ref *)0x0) {
      local_d0.nodeFactory = (factory_type)0x0;
    }
    else {
      (nullAST.ref)->count = (nullAST.ref)->count + 1;
    }
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_78,this,1);
    pAVar1 = &(this->super_LLkParser).super_Parser.astFactory;
    ASTFactory::create(&local_d0,(RefToken *)pAVar1);
    RefCount<AST>::operator=((RefCount<AST> *)&local_d0.nodeFactory,(RefCount<AST> *)&local_d0);
    RefCount<AST>::~RefCount((RefCount<AST> *)&local_d0);
    RefCount<Token>::~RefCount(&local_78);
    if ((Ref *)local_d0.nodeFactory == (Ref *)0x0) {
      local_38.ref = (Ref *)0x0;
    }
    else {
      *(uint *)((long)local_d0.nodeFactory + 8) = *(uint *)((long)local_d0.nodeFactory + 8) + 1;
      local_38.ref = (Ref *)local_d0.nodeFactory;
    }
    ASTFactory::addASTChild(pAVar1,(ASTPair *)(local_c0 + 8),&local_38);
    RefCount<AST>::~RefCount(&local_38);
    Parser::match((Parser *)this,0x21);
  }
  RefCount<AST>::~RefCount((RefCount<AST> *)&local_d0.nodeFactory);
  uVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  RVar4 = nullAST;
  if (uVar3 < 0x22) {
    if ((0x200320080U >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
      if ((ulong)uVar3 != 0x20) goto LAB_0019f4a6;
      if (nullAST.ref == (Ref *)0x0) {
        RVar4.ref = (Ref *)0x0;
      }
      else {
        (nullAST.ref)->count = (nullAST.ref)->count + 1;
      }
      local_d0.nodeFactory = (factory_type)RVar4.ref;
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_88,this,1);
      pAVar1 = &(this->super_LLkParser).super_Parser.astFactory;
      ASTFactory::create(&local_d0,(RefToken *)pAVar1);
      RefCount<AST>::operator=((RefCount<AST> *)&local_d0.nodeFactory,(RefCount<AST> *)&local_d0);
      RefCount<AST>::~RefCount((RefCount<AST> *)&local_d0);
      RefCount<Token>::~RefCount(&local_88);
      if ((Ref *)local_d0.nodeFactory == (Ref *)0x0) {
        local_50.ref = (Ref *)0x0;
      }
      else {
        *(uint *)((long)local_d0.nodeFactory + 8) = *(uint *)((long)local_d0.nodeFactory + 8) + 1;
        local_50.ref = (Ref *)local_d0.nodeFactory;
      }
      ASTFactory::makeASTRoot(pAVar1,(ASTPair *)(local_c0 + 8),&local_50);
      RefCount<AST>::~RefCount(&local_50);
      Parser::match((Parser *)this,0x20);
      iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
      local_d0._vptr_ASTFactory = (_func_int **)nullAST;
      if (iVar2 == 0x11) {
        if (nullAST.ref == (Ref *)0x0) {
          local_d0._vptr_ASTFactory = (_func_int **)0x0;
        }
        else {
          (nullAST.ref)->count = (nullAST.ref)->count + 1;
        }
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_98,this,1);
        ASTFactory::create((ASTFactory *)local_c0,(RefToken *)pAVar1);
        RefCount<AST>::operator=((RefCount<AST> *)&local_d0,(RefCount<AST> *)local_c0);
        RefCount<AST>::~RefCount((RefCount<AST> *)local_c0);
        RefCount<Token>::~RefCount(&local_98);
        if ((Ref *)local_d0._vptr_ASTFactory == (Ref *)0x0) {
          local_60.ref = (Ref *)0x0;
        }
        else {
          *(uint *)((long)local_d0._vptr_ASTFactory + 8) =
               *(uint *)((long)local_d0._vptr_ASTFactory + 8) + 1;
          local_60.ref = (Ref *)local_d0._vptr_ASTFactory;
        }
        ASTFactory::addASTChild(pAVar1,(ASTPair *)(local_c0 + 8),&local_60);
        RefCount<AST>::~RefCount(&local_60);
        Parser::match((Parser *)this,0x11);
      }
      else {
        if (iVar2 != 0x21) {
          pNVar5 = (NoViableAltException *)__cxa_allocate_exception(0x40);
          (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_68,this,1);
          NoViableAltException::NoViableAltException(pNVar5,&local_68);
          __cxa_throw(pNVar5,&NoViableAltException::typeinfo,
                      NoViableAltException::~NoViableAltException);
        }
        if (nullAST.ref == (Ref *)0x0) {
          local_d0._vptr_ASTFactory = (_func_int **)0x0;
        }
        else {
          (nullAST.ref)->count = (nullAST.ref)->count + 1;
        }
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_90,this,1);
        ASTFactory::create((ASTFactory *)local_c0,(RefToken *)pAVar1);
        RefCount<AST>::operator=((RefCount<AST> *)&local_d0,(RefCount<AST> *)local_c0);
        RefCount<AST>::~RefCount((RefCount<AST> *)local_c0);
        RefCount<Token>::~RefCount(&local_90);
        if ((Ref *)local_d0._vptr_ASTFactory == (Ref *)0x0) {
          local_58.ref = (Ref *)0x0;
        }
        else {
          *(uint *)((long)local_d0._vptr_ASTFactory + 8) =
               *(uint *)((long)local_d0._vptr_ASTFactory + 8) + 1;
          local_58.ref = (Ref *)local_d0._vptr_ASTFactory;
        }
        ASTFactory::addASTChild(pAVar1,(ASTPair *)(local_c0 + 8),&local_58);
        RefCount<AST>::~RefCount(&local_58);
        Parser::match((Parser *)this,0x21);
      }
      RefCount<AST>::~RefCount((RefCount<AST> *)&local_d0);
      RefCount<AST>::~RefCount((RefCount<AST> *)&local_d0.nodeFactory);
    }
    RefCount<AST>::operator=(&local_a0,(RefCount<AST> *)(local_c0 + 8));
    RefCount<AST>::operator=(this_00,&local_a0);
    RefCount<AST>::~RefCount(&local_a0);
    RefCount<AST>::~RefCount(aRStack_b0);
    RefCount<AST>::~RefCount((RefCount<AST> *)(local_c0 + 8));
    return;
  }
LAB_0019f4a6:
  pNVar5 = (NoViableAltException *)__cxa_allocate_exception(0x40);
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_70,this,1);
  NoViableAltException::NoViableAltException(pNVar5,&local_70);
  __cxa_throw(pNVar5,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
}

Assistant:

void GrpParser::charOrIntOrRange() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST charOrIntOrRange_AST = nullAST;
	
	try {      // for error handling
		{
		switch ( LA(1)) {
		case LIT_CHAR:
		{
			RefAST tmp139_AST = nullAST;
			tmp139_AST = astFactory.create(LT(1));
			astFactory.addASTChild(currentAST, tmp139_AST);
			match(LIT_CHAR);
			break;
		}
		case LIT_INT:
		{
			RefAST tmp140_AST = nullAST;
			tmp140_AST = astFactory.create(LT(1));
			astFactory.addASTChild(currentAST, tmp140_AST);
			match(LIT_INT);
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		{
		switch ( LA(1)) {
		case OP_DOTDOT:
		{
			RefAST tmp141_AST = nullAST;
			tmp141_AST = astFactory.create(LT(1));
			astFactory.makeASTRoot(currentAST, tmp141_AST);
			match(OP_DOTDOT);
			{
			switch ( LA(1)) {
			case LIT_CHAR:
			{
				RefAST tmp142_AST = nullAST;
				tmp142_AST = astFactory.create(LT(1));
				astFactory.addASTChild(currentAST, tmp142_AST);
				match(LIT_CHAR);
				break;
			}
			case LIT_INT:
			{
				RefAST tmp143_AST = nullAST;
				tmp143_AST = astFactory.create(LT(1));
				astFactory.addASTChild(currentAST, tmp143_AST);
				match(LIT_INT);
				break;
			}
			default:
			{
				throw NoViableAltException(LT(1));
			}
			}
			}
			break;
		}
		case OP_RPAREN:
		case LIT_INT:
		case LIT_STRING:
		case OP_COMMA:
		case LIT_CHAR:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		charOrIntOrRange_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_38);
	}
	returnAST = charOrIntOrRange_AST;
}